

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<Header>::replace(QList<Header> *this,qsizetype i,rvalue_ref t)

{
  Header *in_RDX;
  Header *in_RDI;
  long in_FS_OFFSET;
  DataPointer oldData;
  QArrayDataPointer<Header> *in_stack_ffffffffffffffb0;
  QArrayDataPointer<Header> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = -0x5555555555555556;
  local_28.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.ptr = (Header *)0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<Header>::QArrayDataPointer(&local_28);
  QArrayDataPointer<Header>::detach(in_stack_ffffffffffffffb0,(QArrayDataPointer<Header> *)in_RDI);
  QArrayDataPointer<Header>::data((QArrayDataPointer<Header> *)in_RDI);
  Header::operator=(in_RDX,in_RDI);
  QArrayDataPointer<Header>::~QArrayDataPointer((QArrayDataPointer<Header> *)in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replace(qsizetype i, rvalue_ref t)
    {
        if constexpr (DataPointer::pass_parameter_by_value) {
            Q_UNUSED(i);
            Q_UNUSED(t);
        } else {
            Q_ASSERT_X(i >= 0 && i < d->size, "QList<T>::replace", "index out of range");
            DataPointer oldData;
            d.detach(&oldData);
            d.data()[i] = std::move(t);
        }
    }